

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

void print(int **arr,string *s,int width)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  int local_24;
  int local_20;
  int j;
  int i;
  int width_local;
  string *s_local;
  int **arr_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)s);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_20 = 1; local_20 <= bsize; local_20 = local_20 + 1) {
    for (local_24 = 1; local_24 <= bsize; local_24 = local_24 + 1) {
      _Var1 = std::setfill<char>(' ');
      poVar3 = std::operator<<(&std::cout,_Var1._M_c);
      _Var2 = std::setw(width);
      poVar3 = std::operator<<(poVar3,_Var2);
      std::ostream::operator<<(poVar3,arr[local_20][local_24]);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void print(int **arr, const string &s, int width = 1) {
    cout << s << endl;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            cout << setfill(' ') << setw(width) << arr[i][j];
        }
        cout << endl;
    }
}